

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::Term::Term(Term *this)

{
  allocator local_31;
  string local_30 [32];
  Term *local_10;
  Term *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Term",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<MyCompiler::Factor>::shared_ptr(&this->pFactor);
  std::
  vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  ::vector(&this->vMulDivOpFactor);
  return;
}

Assistant:

MyCompiler::Term::Term()
        : AbstractAstNode("Term")
{}